

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageReceiver.cpp
# Opt level: O0

int __thiscall unixsocketipc::MessageReceiver::init(MessageReceiver *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  function<void_()> *in_RCX;
  function<void_(unsigned_int,_const_char_*,_unsigned_int)> *in_RDX;
  undefined1 local_9e [2];
  uint local_length;
  sockaddr_un local;
  OnClientConnected *oc_local;
  CallbackFunc *cb_local;
  char *filename_local;
  MessageReceiver *this_local;
  
  std::__cxx11::string::operator=((string *)&this->socket_filename,(char *)ctx);
  iVar1 = socket(1,1,0);
  this->server_socket_fd = iVar1;
  if (this->server_socket_fd == -1) {
    this_local._7_1_ = 0;
  }
  else {
    pcVar3 = (char *)operator_new__(0x100000);
    this->message_buf = pcVar3;
    local_9e = (undefined1  [2])0x1;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    strcpy((char *)&local_length,pcVar3);
    unlink((char *)&local_length);
    sVar4 = strlen((char *)&local_length);
    iVar1 = bind(this->server_socket_fd,(sockaddr *)local_9e,(int)sVar4 + 2);
    if (iVar1 == -1) {
      uVar2 = close(this->server_socket_fd);
      this = (MessageReceiver *)(ulong)uVar2;
      this_local._7_1_ = 0;
    }
    else {
      std::function<void_(unsigned_int,_const_char_*,_unsigned_int)>::operator=
                (&this->callback,in_RDX);
      this = (MessageReceiver *)std::function<void_()>::operator=(&this->on_client_connected,in_RCX)
      ;
      this_local._7_1_ = 1;
    }
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool MessageReceiver::init(const char *filename, CallbackFunc cb, OnClientConnected oc) {
   // remember socket filename
   socket_filename = filename;

   // get a socket filedescriptor
   server_socket_fd = socket(AF_UNIX, SOCK_STREAM, 0);

   // check socket for failure
   if (server_socket_fd == -1) {
      DEBUG_MSG("%s: socket(AF_UNIX, SOCK_STREAM, 0) failed\n", __FUNCTION__);
      return false;
   }

   // prepare buffer
   message_buf = new char[MESSAGE_BUFF_SIZE];

   DEBUG_MSG("%s: binding to %s...\n", __FUNCTION__, socket_filename.c_str());
      // prepare address struct
      sockaddr_un local;
      local.sun_family = AF_UNIX;

      strcpy(local.sun_path, socket_filename.c_str());

      // delete socket file if such already exists
      unlink(local.sun_path);

      // bind socket to address in UNIX domain
      unsigned local_length = strlen(local.sun_path) + sizeof(local.sun_family);
      if (bind(server_socket_fd, (sockaddr*)&local, local_length) == -1) {
         DEBUG_MSG("%s: bind failed\n", __FUNCTION__);
         ::close(server_socket_fd);
         return false;
      }
   DEBUG_MSG("%s: done.\n", __FUNCTION__);

   // setup callbacks
   callback = cb;
   on_client_connected = oc;

   // success
   return true;
}